

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::insert_position(Fl_Text_Display *this,int newPos)

{
  int iVar1;
  int endpos;
  int iVar2;
  
  if (this->mCursorPos == newPos) {
    return;
  }
  iVar2 = 0;
  if (0 < newPos) {
    iVar2 = newPos;
  }
  iVar1 = this->mBuffer->mLength;
  if (iVar1 <= iVar2) {
    iVar2 = iVar1;
  }
  this->mCursorPreferredXPos = -1;
  iVar1 = Fl_Text_Buffer::prev_char_clipped(this->mBuffer,this->mCursorPos);
  endpos = Fl_Text_Buffer::next_char(this->mBuffer,this->mCursorPos);
  redisplay_range(this,iVar1,endpos);
  this->mCursorPos = iVar2;
  iVar2 = Fl_Text_Buffer::prev_char_clipped(this->mBuffer,iVar2);
  iVar1 = Fl_Text_Buffer::next_char(this->mBuffer,this->mCursorPos);
  redisplay_range(this,iVar2,iVar1);
  return;
}

Assistant:

void Fl_Text_Display::insert_position( int newPos ) {
  IS_UTF8_ALIGNED2(buffer(), newPos)

  /* make sure new position is ok, do nothing if it hasn't changed */
  if ( newPos == mCursorPos ) return;
  if ( newPos < 0 ) newPos = 0;
  if ( newPos > mBuffer->length() ) newPos = mBuffer->length();

  /* cursor movement cancels vertical cursor motion column */
  mCursorPreferredXPos = -1;

  /* erase the cursor at its previous position */
  redisplay_range(buffer()->prev_char_clipped(mCursorPos), buffer()->next_char(mCursorPos));

  mCursorPos = newPos;

  /* draw cursor at its new position */
  redisplay_range(buffer()->prev_char_clipped(mCursorPos), buffer()->next_char(mCursorPos));
}